

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

int __thiscall mkvparser::Track::Info::CopyStr(Info *this,offset_in_Info_to_unknown str,Info *dst_)

{
  char *__s;
  long *plVar1;
  size_t __n;
  char *pcVar2;
  size_t len;
  char *src;
  char **dst;
  Info *dst__local;
  offset_in_Info_to_unknown str_local;
  Info *this_local;
  
  if (str == 0xffffffffffffffff) {
    this_local._4_4_ = -1;
  }
  else {
    plVar1 = (long *)((long)&dst_->type + str);
    if (*plVar1 == 0) {
      __s = *(char **)((long)&this->type + str);
      if (__s == (char *)0x0) {
        this_local._4_4_ = 0;
      }
      else {
        __n = strlen(__s);
        pcVar2 = SafeArrayAlloc<char>(1,__n + 1);
        *plVar1 = (long)pcVar2;
        if (*plVar1 == 0) {
          this_local._4_4_ = -1;
        }
        else {
          memcpy((void *)*plVar1,__s,__n);
          *(undefined1 *)(*plVar1 + __n) = 0;
          this_local._4_4_ = 0;
        }
      }
    }
    else {
      this_local._4_4_ = -1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Track::Info::CopyStr(char* Info::*str, Info& dst_) const {
  if (str == static_cast<char * Info::*>(NULL))
    return -1;

  char*& dst = dst_.*str;

  if (dst)  // should be NULL already
    return -1;

  const char* const src = this->*str;

  if (src == NULL)
    return 0;

  const size_t len = strlen(src);

  dst = SafeArrayAlloc<char>(1, len + 1);

  if (dst == NULL)
    return -1;

  memcpy(dst, src, len);
  dst[len] = '\0';

  return 0;
}